

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  pointer ppFVar2;
  FieldDescriptor *pFVar3;
  SCCAnalyzer *pSVar4;
  bool bVar5;
  byte bVar6;
  CppType CVar7;
  Descriptor *pDVar8;
  LogMessage *pLVar9;
  undefined8 extraout_RDX;
  AlphaNum *a;
  undefined8 extraout_RDX_00;
  undefined8 uVar10;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *pFVar11;
  long lVar12;
  int i;
  long lVar13;
  ulong uVar14;
  undefined8 *puVar15;
  Hex hex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks;
  LogMessage local_a8;
  string local_70;
  string local_50;
  
  io::Printer::Print(printer,"bool $classname$::IsInitialized() const {\n","classname",
                     &this->classname_);
  io::Printer::Indent(printer);
  pDVar8 = this->descriptor_;
  if (0 < *(int *)(pDVar8 + 0x68)) {
    io::Printer::Print(printer,"if (!_extensions_.IsInitialized()) {\n  return false;\n}\n\n");
    pDVar8 = this->descriptor_;
  }
  if (*(int *)(*(long *)(pDVar8 + 0x10) + 0x8c) != 3) {
    RequiredFieldsBitMask(&masks,this);
    uVar10 = extraout_RDX;
    for (uVar14 = 0;
        uVar14 < (ulong)((long)masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2); uVar14 = uVar14 + 1)
    {
      uVar1 = masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14];
      if ((ulong)uVar1 != 0) {
        SimpleItoa_abi_cxx11_(&local_70,(protobuf *)(uVar14 & 0xffffffff),(int)uVar10);
        hex._8_8_ = 8;
        hex.value = (ulong)uVar1;
        strings::AlphaNum::AlphaNum((AlphaNum *)&local_a8,hex);
        StrCat_abi_cxx11_(&local_50,(protobuf *)&local_a8,a);
        io::Printer::Print(printer,"if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n",
                           "i",&local_70,"mask",&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        uVar10 = extraout_RDX_00;
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  for (uVar14 = 0;
      ppFVar2 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar14 < (ulong)((long)(this->optimized_order_).
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3);
      uVar14 = uVar14 + 1) {
    pFVar3 = ppFVar2[uVar14];
    CVar7 = FieldDescriptor::cpp_type(pFVar3);
    if (CVar7 == CPPTYPE_MESSAGE) {
      pSVar4 = this->scc_analyzer_;
      pDVar8 = FieldDescriptor::message_type(pFVar3);
      bVar5 = SCCAnalyzer::HasRequiredFields(pSVar4,pDVar8);
      if (bVar5) {
        if (*(int *)(pFVar3 + 0x4c) == 3) {
          FieldName_abi_cxx11_((string *)&local_a8,(cpp *)pFVar3,field);
          io::Printer::Print(printer,
                             "if (!::google::protobuf::internal::AllAreInitialized(this->$name$())) return false;\n"
                             ,"name",(string *)&local_a8);
        }
        else {
          if (*(char *)(*(long *)(pFVar3 + 0x80) + 0x6f) != '\0') goto LAB_0027f044;
          pFVar11 = field;
          if (*(long *)(pFVar3 + 0x60) != 0) {
            internal::LogMessage::LogMessage
                      (&local_a8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x10b6);
            pLVar9 = internal::LogMessage::operator<<
                               (&local_a8,"CHECK failed: !field->containing_oneof(): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar9);
            internal::LogMessage::~LogMessage(&local_a8);
            pFVar11 = extraout_RDX_01;
          }
          FieldName_abi_cxx11_((string *)&local_a8,(cpp *)pFVar3,pFVar11);
          io::Printer::Print(printer,
                             "if (has_$name$()) {\n  if (!this->$name$_->IsInitialized()) return false;\n}\n"
                             ,"name",(string *)&local_a8);
        }
        std::__cxx11::string::~string((string *)&local_a8);
      }
    }
LAB_0027f044:
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"if (!_weak_field_map_.IsInitialized()) return false;\n");
  }
  lVar12 = 0;
  do {
    if (*(int *)(this->descriptor_ + 0x38) <= lVar12) {
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"  return true;\n}\n");
      return;
    }
    puVar15 = (undefined8 *)(lVar12 * 0x30 + *(long *)(this->descriptor_ + 0x40));
    lVar13 = 0;
LAB_0027f091:
    if (*(int *)((long)puVar15 + 0x1c) <= lVar13) goto LAB_0027f28c;
    pFVar3 = *(FieldDescriptor **)(puVar15[4] + lVar13 * 8);
    CVar7 = FieldDescriptor::cpp_type(pFVar3);
    if (CVar7 != CPPTYPE_MESSAGE) {
LAB_0027f0db:
      lVar13 = lVar13 + 1;
      goto LAB_0027f091;
    }
    pSVar4 = this->scc_analyzer_;
    pDVar8 = FieldDescriptor::message_type(pFVar3);
    bVar5 = SCCAnalyzer::HasRequiredFields(pSVar4,pDVar8);
    if (!bVar5) goto LAB_0027f0db;
    io::Printer::Print(printer,"switch ($oneofname$_case()) {\n","oneofname",(string *)*puVar15);
    io::Printer::Indent(printer);
    for (lVar13 = 0; lVar13 < *(int *)((long)puVar15 + 0x1c); lVar13 = lVar13 + 1) {
      pFVar3 = *(FieldDescriptor **)(puVar15[4] + lVar13 * 8);
      UnderscoresToCamelCase((string *)&local_a8,*(string **)pFVar3,true);
      io::Printer::Print(printer,"case k$field_name$: {\n","field_name",(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      io::Printer::Indent(printer);
      CVar7 = FieldDescriptor::cpp_type(pFVar3);
      if (CVar7 == CPPTYPE_MESSAGE) {
        pSVar4 = this->scc_analyzer_;
        pDVar8 = FieldDescriptor::message_type(pFVar3);
        bVar5 = SCCAnalyzer::HasRequiredFields(pSVar4,pDVar8);
        if (bVar5) {
          if ((*(char *)(*(long *)(pFVar3 + 0x80) + 0x6f) != '\0') ||
             (bVar6 = 0, pFVar11 = extraout_RDX_02, *(long *)(pFVar3 + 0x60) == 0)) {
            internal::LogMessage::LogMessage
                      (&local_a8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x10e6);
            pLVar9 = internal::LogMessage::operator<<
                               (&local_a8,
                                "CHECK failed: !(field->options().weak() || !field->containing_oneof()): "
                               );
            internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar9);
            internal::LogMessage::~LogMessage(&local_a8);
            bVar6 = *(byte *)(*(long *)(pFVar3 + 0x80) + 0x6f);
            pFVar11 = extraout_RDX_03;
          }
          if ((bVar6 & 1) == 0) {
            FieldName_abi_cxx11_((string *)&local_a8,(cpp *)pFVar3,pFVar11);
            io::Printer::Print(printer,
                               "if (has_$name$()) {\n  if (!this->$name$().IsInitialized()) return false;\n}\n"
                               ,"name",(string *)&local_a8);
            std::__cxx11::string::~string((string *)&local_a8);
          }
        }
      }
      io::Printer::Print(printer,"break;\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
    }
    ToUpper((string *)&local_a8,(string *)*puVar15);
    io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","cap_oneof_name",
                       (string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
LAB_0027f28c:
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateIsInitialized(io::Printer* printer) {
  printer->Print(
    "bool $classname$::IsInitialized() const {\n",
    "classname", classname_);
  printer->Indent();

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (!_extensions_.IsInitialized()) {\n"
      "  return false;\n"
      "}\n\n");
  }

  if (HasFieldPresence(descriptor_->file())) {
    // Check that all required fields in this message are set.  We can do this
    // most efficiently by checking 32 "has bits" at a time.
    const std::vector<uint32> masks = RequiredFieldsBitMask();

    for (int i = 0; i < masks.size(); i++) {
      uint32 mask = masks[i];
      if (mask == 0) {
        continue;
      }

      // TODO(ckennelly): Consider doing something similar to ByteSizeLong(),
      // where we check all of the required fields in a single branch (assuming
      // that we aren't going to benefit from early termination).
      printer->Print(
        "if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n",
        "i", SimpleItoa(i),
        "mask", StrCat(strings::Hex(mask, strings::ZERO_PAD_8)));
    }
  }

  // Now check that all non-oneof embedded messages are initialized.
  for (int i = 0; i < optimized_order_.size(); i++) {
    const FieldDescriptor* field = optimized_order_[i];
    // TODO(ckennelly): Push this down into a generator?
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !ShouldIgnoreRequiredFieldCheck(field, options_) &&
        scc_analyzer_->HasRequiredFields(field->message_type())) {
      if (field->is_repeated()) {
        printer->Print(
          "if (!::google::protobuf::internal::AllAreInitialized(this->$name$()))"
          " return false;\n",
          "name", FieldName(field));
      } else if (field->options().weak()) {
        continue;
      } else {
        GOOGLE_CHECK(!field->containing_oneof());
        printer->Print(
            "if (has_$name$()) {\n"
            "  if (!this->$name$_->IsInitialized()) return false;\n"
            "}\n",
            "name", FieldName(field));
      }
    }
  }
  if (num_weak_fields_) {
    // For Weak fields.
    printer->Print("if (!_weak_field_map_.IsInitialized()) return false;\n");
  }
  // Go through the oneof fields, emitting a switch if any might have required
  // fields.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);

    bool has_required_fields = false;
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);

      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
          !ShouldIgnoreRequiredFieldCheck(field, options_) &&
          scc_analyzer_->HasRequiredFields(field->message_type())) {
        has_required_fields = true;
        break;
      }
    }

    if (!has_required_fields) {
      continue;
    }

    printer->Print(
        "switch ($oneofname$_case()) {\n",
        "oneofname", oneof->name());
    printer->Indent();
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();

      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
          !ShouldIgnoreRequiredFieldCheck(field, options_) &&
          scc_analyzer_->HasRequiredFields(field->message_type())) {
        GOOGLE_CHECK(!(field->options().weak() || !field->containing_oneof()));
        if (field->options().weak()) {
          // Just skip.
        } else {
          printer->Print(
            "if (has_$name$()) {\n"
            "  if (!this->$name$().IsInitialized()) return false;\n"
            "}\n",
            "name", FieldName(field));
        }
      }

      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(oneof->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }

  printer->Outdent();
  printer->Print(
    "  return true;\n"
    "}\n");
}